

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O1

void PyreNet::LayerThreadPool::threadJob(void)

{
  _Elt_pointer pLVar1;
  vector<double,_std::allocator<double>_> *input;
  Perceptron *this;
  Activation *activation;
  int *piVar2;
  int iVar3;
  LayerThreadPool *pLVar4;
  undefined8 uVar5;
  undefined1 local_48 [8];
  unique_lock<std::mutex> lg;
  
  pLVar4 = getInstance();
  local_48 = (undefined1  [8])&pLVar4->queueMutex;
  lg._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  lg._M_device._0_1_ = 1;
  lg._8_8_ = &pLVar4->trackMutex;
  while( true ) {
    while (pLVar1 = (pLVar4->layerQueue).c.
                    super__Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (pLVar4->layerQueue).c.
          super__Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == pLVar1) {
      std::condition_variable::wait((unique_lock *)&pLVar4->newJobCv);
    }
    input = pLVar1->input;
    this = pLVar1->p;
    activation = pLVar1->activation;
    piVar2 = pLVar1->track;
    std::
    deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
    ::pop_front(&(pLVar4->layerQueue).c);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_48);
    Perceptron::calculate(this,input,activation);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)lg._8_8_);
    if (iVar3 != 0) break;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
    pthread_mutex_unlock((pthread_mutex_t *)lg._8_8_);
  }
  uVar5 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock((pthread_mutex_t *)lg._8_8_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  _Unwind_Resume(uVar5);
}

Assistant:

[[noreturn]] void LayerThreadPool::threadJob() {
        LayerThreadPool* tpi = getInstance();
        std::unique_lock<std::mutex> lg(tpi->queueMutex);
        while (true) {
            if (!tpi->layerQueue.empty()) {
                LayerQueueJob job = tpi->layerQueue.front();
                tpi->layerQueue.pop();
                lg.unlock();
                job.p.calculate(job.input, job.activation);
                std::lock_guard<std::mutex> lgt(tpi->trackMutex);
                job.track--;
                if (job.track == 0) {
                    tpi->jobDoneCv.notify_all();
                }
                lg.lock();
            } else {
                tpi->newJobCv.wait(lg);
            }
        }
    }